

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O2

uint embree::createClothSheet(RTCScene scene)

{
  vector<Triangle,_std::allocator<Triangle>_> *this;
  unsigned_long uVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  ClothModel *pCVar5;
  ulong uVar6;
  DistanceConstraint *this_00;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  size_t j;
  ulong uVar13;
  ulong uVar14;
  pointer puVar15;
  DistanceConstraint *local_98;
  ClothModel *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sIDs;
  vec_t gravity;
  vec_t nullvec;
  
  pCVar5 = (ClothModel *)::operator_new(0x118);
  (pCVar5->super_Mesh)._vptr_Mesh = (_func_int **)0x0;
  (pCVar5->super_Mesh).x_.super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar5->super_Mesh).x_.super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar5->super_Mesh).x_.super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar5->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar5->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar5->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar5->x_0_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar5->super_Mesh)._vptr_Mesh = (_func_int **)&PTR__ClothModel_002aac20;
  memset(&pCVar5->x_0_,0,0xd8);
  pCVar5->k_stretch_ = 1.0;
  pCVar5->k_damp_ = 1.0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&pCVar5->x_0_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (&(pCVar5->super_Mesh).x_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&pCVar5->x_old_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&pCVar5->x_last_,NZ * NX);
  nullvec.field_0._0_8_ = 0;
  nullvec.field_0._8_8_ = 0;
  gravity.field_0._0_8_ = 0xc11ccccd00000000;
  gravity.field_0._8_8_ = 0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&pCVar5->v_,NZ * NX,&nullvec)
  ;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&pCVar5->a_,NZ * NX,&gravity)
  ;
  std::vector<float,_std::allocator<float>_>::resize(&pCVar5->m_,NZ * NX,(value_type_conflict1 *)&m)
  ;
  sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::resize
            (&pCVar5->m_inv_,NZ * NX,(value_type_conflict1 *)&sIDs);
  this = &(pCVar5->super_Mesh).tris_;
  std::vector<Triangle,_std::allocator<Triangle>_>::resize(this,(NZ - 1) * (NX * 2 + -2));
  initializeClothPositions(pCVar5);
  iVar3 = 1;
  lVar8 = 0;
  uVar14 = 0;
  while (lVar11 = NX, uVar14 < NX - 1U) {
    lVar11 = 0xc;
    for (uVar13 = 0; uVar13 < NZ - 1; uVar13 = uVar13 + 1) {
      iVar10 = (int)uVar14;
      iVar12 = (int)uVar13;
      *(int *)((long)&(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                      super__Vector_impl_data._M_start[-1].v0 +
              (NZ + 0x7fffffffffffffff) * lVar8 + lVar11) = iVar10 * (int)NZ + iVar12;
      *(int *)((long)(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                     super__Vector_impl_data._M_start +
              lVar11 + -8 + (NZ + 0x7fffffffffffffff) * lVar8) = (int)NZ * iVar10 + iVar12 + 1;
      *(int *)((long)(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                     super__Vector_impl_data._M_start +
              lVar11 + -4 + (NZ + 0x7fffffffffffffff) * lVar8) = iVar3 * (int)NZ + iVar12 + 1;
      *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v0 +
              lVar11 + (NZ + 0x7fffffffffffffff) * lVar8) = (int)NZ * iVar3 + iVar12 + 1;
      *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v1 +
              lVar11 + (NZ + 0x7fffffffffffffff) * lVar8) = (int)NZ * iVar3 + iVar12;
      *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                       super__Vector_impl_data._M_start)->v2 +
              lVar11 + (NZ + 0x7fffffffffffffff) * lVar8) = (int)NZ * iVar10 + iVar12;
      lVar11 = lVar11 + 0x18;
    }
    lVar8 = lVar8 + 0x18;
    iVar3 = iVar3 + 1;
    uVar14 = uVar14 + 1;
  }
  pCVar5->k_stretch_ = 4000.0;
  pCVar5->k_damp_ = 0.2;
  local_90 = pCVar5;
  for (uVar14 = 0; uVar13 = NZ, uVar14 < NZ * lVar11; uVar14 = uVar14 + 1) {
    uVar6 = uVar14 / NZ;
    uVar9 = uVar14 % NZ;
    sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar6 < lVar11 - 1U) {
      local_98 = (DistanceConstraint *)(NZ + uVar14);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&sIDs,(unsigned_long *)&local_98);
    }
    if (uVar9 < NZ - 1) {
      local_98 = (DistanceConstraint *)(uVar14 + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&sIDs,(unsigned_long *)&local_98);
    }
    if ((uVar6 < NX - 1U) && (uVar9 < NZ - 1)) {
      local_98 = (DistanceConstraint *)(NZ + uVar14 + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&sIDs,(unsigned_long *)&local_98);
    }
    puVar15 = sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar2 = sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((uVar13 <= uVar14) && (uVar9 < NZ - 1)) {
      local_98 = (DistanceConstraint *)((uVar14 - NZ) + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&sIDs,(unsigned_long *)&local_98);
      puVar15 = sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; puVar15 != puVar2; puVar15 = puVar15 + 1) {
      uVar1 = *puVar15;
      this_00 = (DistanceConstraint *)::operator_new(0x28);
      collide2::DistanceConstraint::DistanceConstraint(this_00);
      (*(this_00->super_Constraint)._vptr_Constraint[3])(this_00,local_90,uVar14,uVar1);
      local_98 = this_00;
      std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>::
      emplace_back<embree::collide2::Constraint*>
                ((vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                  *)&pCVar5->m_constraints_,(Constraint **)&local_98);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    lVar11 = NX;
  }
  uVar7 = rtcNewGeometry(g_device,0x78);
  pCVar5 = local_90;
  uVar4 = rtcAttachGeometry(scene,uVar7);
  lVar8 = (long)(pCVar5->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pCVar5->super_Mesh).tris_.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
  rtcSetGeometryUserPrimitiveCount(uVar7,lVar8 / 0xc & 0xffffffff,lVar8 % 0xc);
  rtcSetGeometryUserData(uVar7,uVar4);
  rtcSetGeometryBoundsFunction(uVar7,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar7,triangle_intersect_func);
  rtcCommitGeometry(uVar7);
  rtcReleaseGeometry(uVar7);
  sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pCVar5;
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
  ::
  emplace_back<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>
            ((vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
              *)&meshes,
             (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             &sIDs);
  if (sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*sIDs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + 8))();
  }
  return uVar4;
}

Assistant:

unsigned int createClothSheet (RTCScene scene)
{
  std::unique_ptr<collide2::ClothModel> cloth (new collide2::ClothModel());
  cloth->x_0_.resize (NX*NZ);
  cloth->x_.resize (NX*NZ);
  cloth->x_old_.resize (NX*NZ);
  cloth->x_last_.resize (NX*NZ);
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  collide2::vec_t gravity(0.f, -9.8f, 0.f);
  cloth->v_.resize (NX*NZ, nullvec);
  cloth->a_.resize (NX*NZ, gravity);
  cloth->m_.resize (NX*NZ, m);
  cloth->m_inv_.resize (NX*NZ, 1.f / m);
  cloth->tris_.resize (2*(NX-1)*(NZ-1));

  initializeClothPositions (*cloth);

  // init topology
  for (size_t i=0; i<NX-1; ++i) {
    for (size_t j=0; j<NZ-1; ++j) {
      cloth->tris_[2*(i*(NZ-1)+j)].v0 = i*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)].v1 = i*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)].v2 = (i+1)*NZ+j+1;

      cloth->tris_[2*(i*(NZ-1)+j)+1].v0 = (i+1)*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v1 = (i+1)*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v2 = i*NZ+j;
    }
  }

  cloth->k_stretch_ = ks;
  cloth->k_damp_ = damping;

  // set distance constraints
  for (size_t vID=0; vID<NX*NZ; ++vID) {
    
    size_t i = vID/NZ;
    size_t j = vID%NZ;

    std::vector<size_t> sIDs;

    if (i<NX-1) sIDs.push_back (vID+NZ);
    if (j<NZ-1) sIDs.push_back (vID+1);

    if (i<NX-1) {
      if (j<NZ-1) {
        sIDs.push_back (vID+NZ+1);
      }
    }

    if (i>0) {
      if (j<NZ-1) {
        sIDs.push_back (vID-NZ+1);
      }
    }

    for (auto id : sIDs) {
      auto c = new collide2::DistanceConstraint ();
      c->initConstraint (*cloth, vID, id);
      cloth->m_constraints_.push_back (c);
    }
  }

  // fix corners
  // cloth->m_[0] = 0.f;
  // cloth->m_[(NX-1)*NZ] = 0.f;
  // cloth->m_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_[NZ-1] = 0.f;
  // cloth->m_inv_[0] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_inv_[NZ-1] = 0.f;
  // cloth->a_[0].y = 0.f;
  // cloth->a_[(NX-1)*NZ].y = 0.f;
  // cloth->a_[(NX-1)*NZ + NZ-1].y = 0.f;
  // cloth->a_[NZ-1].y = 0.f;

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, cloth->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (cloth));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, cloth->x_.data(), 0, sizeof(collide2::vec_t), cloth->x_.size());
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX , 0, RTC_FORMAT_UINT3,  cloth->tris_.data(), 0, sizeof(Triangle), cloth->tris_.size());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (cloth));
  //   return geomID;
  // }
}